

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Yolov3DetectionOutput_x86::forward
          (Yolov3DetectionOutput_x86 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  __normal_iterator<const_ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
  __last;
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  float *pfVar4;
  Yolov3DetectionOutput *pYVar5;
  reference pvVar6;
  reference this_00;
  reference pvVar7;
  Allocator *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  float fVar8;
  double dVar9;
  float *outptr;
  float score;
  BBoxRect *r;
  int i_3;
  Mat *top_blob;
  int num_detected;
  size_t z;
  size_t i_2;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *box_bbox_rects;
  int i_1;
  BBoxRect c;
  float area;
  float bbox_ymax;
  float bbox_xmax;
  float bbox_ymin;
  float bbox_xmin;
  float bbox_h;
  float bbox_w;
  float bbox_cy;
  float bbox_cx;
  float confidence;
  int q;
  float *end;
  float *ptr;
  float class_score;
  int class_index;
  int j;
  int i;
  int cs;
  Mat scores;
  float *box_score_ptr;
  float *hptr;
  float *wptr;
  float *yptr;
  float *xptr;
  float bias_h;
  float bias_w;
  int biases_index;
  int p;
  int pp;
  int net_h;
  int net_w;
  size_t mask_offset;
  int channels_per_box;
  int channels;
  int h;
  int w;
  Mat *bottom_top_blobs;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  all_box_bbox_rects;
  size_t b;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *in_stack_fffffffffffffb98;
  Mat *in_stack_fffffffffffffba0;
  undefined7 in_stack_fffffffffffffba8;
  undefined1 in_stack_fffffffffffffbaf;
  Yolov3DetectionOutput *in_stack_fffffffffffffbb0;
  size_type in_stack_fffffffffffffbb8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar10;
  Mat *in_stack_fffffffffffffbc0;
  iterator in_stack_fffffffffffffbc8;
  float in_stack_fffffffffffffbdc;
  float in_stack_fffffffffffffbe0;
  float in_stack_fffffffffffffbe4;
  float in_stack_fffffffffffffbe8;
  float in_stack_fffffffffffffbec;
  __normal_iterator<const_ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
  in_stack_fffffffffffffbf0;
  const_iterator in_stack_fffffffffffffbf8;
  int local_38c;
  Yolov3DetectionOutput *local_370;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_368;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_350;
  BBoxRect *local_338;
  BBoxRect *local_330;
  BBoxRect *local_328;
  BBoxRect *local_320;
  reference local_310;
  int local_304;
  float local_300;
  float local_2fc;
  float local_2f8;
  float local_2f4;
  float local_2f0;
  float local_2ec;
  int local_2e8;
  float local_2e4;
  float local_2e0;
  float local_2dc;
  float local_2d8;
  float local_2d4;
  float local_2d0;
  float local_2cc;
  float local_2c8;
  float local_2c4;
  float local_2c0;
  int local_2bc;
  float *local_2b8;
  float *local_2b0;
  float local_2a4;
  int local_2a0;
  int local_29c;
  int local_298;
  int local_294;
  long local_290;
  undefined8 local_250;
  Mat local_248;
  Yolov3DetectionOutput *local_200;
  Mat local_1f8;
  BBoxRect *local_1b0;
  Mat local_1a8;
  float *local_160;
  Mat local_158;
  float *local_110;
  Mat local_108;
  float *local_c0;
  float local_b4;
  float local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  long local_98;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  const_reference local_78;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  local_60;
  ulong local_48;
  undefined1 local_40 [60];
  int local_4;
  
  local_40._32_8_ = in_RDX;
  local_40._40_8_ = in_RSI;
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            *)0x6daa14);
  local_48 = 0;
  while( true ) {
    uVar1 = local_48;
    sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size
                      ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_40._40_8_);
    if (sVar3 <= uVar1) break;
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              *)0x6daa66);
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    local_78 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                         ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_40._40_8_,local_48)
    ;
    local_7c = local_78->w;
    local_80 = local_78->h;
    local_84 = local_78->c;
    local_88 = local_84 / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
    if (local_88 == *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) + 5) {
      local_98 = local_48 * (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      pfVar4 = Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x170),local_48);
      local_9c = (int)(*pfVar4 * (float)local_7c);
      pfVar4 = Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x170),local_48);
      local_a0 = (int)(*pfVar4 * (float)local_80);
      for (local_a4 = 0; local_a4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          local_a4 = local_a4 + 1) {
        local_a8 = local_a4 * local_88;
        pfVar4 = Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x128),
                                 local_a4 + local_98);
        local_ac = (int)*pfVar4;
        pfVar4 = Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0),
                                 (long)(local_ac * 2));
        local_b0 = *pfVar4;
        pfVar4 = Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0),
                                 (long)(local_ac * 2 + 1));
        local_b4 = *pfVar4;
        Mat::channel((Mat *)in_stack_fffffffffffffbc8._M_current,
                     (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20));
        pfVar4 = Mat::operator_cast_to_float_(&local_108);
        Mat::~Mat((Mat *)0x6dad7e);
        local_c0 = pfVar4;
        Mat::channel((Mat *)in_stack_fffffffffffffbc8._M_current,
                     (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20));
        pfVar4 = Mat::operator_cast_to_float_(&local_158);
        Mat::~Mat((Mat *)0x6dadcc);
        local_110 = pfVar4;
        Mat::channel((Mat *)in_stack_fffffffffffffbc8._M_current,
                     (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20));
        pfVar4 = Mat::operator_cast_to_float_(&local_1a8);
        Mat::~Mat((Mat *)0x6dae1b);
        local_160 = pfVar4;
        Mat::channel((Mat *)in_stack_fffffffffffffbc8._M_current,
                     (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20));
        in_stack_fffffffffffffbf8._M_current = (BBoxRect *)Mat::operator_cast_to_float_(&local_1f8);
        Mat::~Mat((Mat *)0x6dae6a);
        local_1b0 = in_stack_fffffffffffffbf8._M_current;
        Mat::channel((Mat *)in_stack_fffffffffffffbc8._M_current,
                     (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20));
        in_stack_fffffffffffffbf0._M_current = (BBoxRect *)Mat::operator_cast_to_float_(&local_248);
        Mat::~Mat((Mat *)0x6daeb9);
        local_200 = (Yolov3DetectionOutput *)in_stack_fffffffffffffbf0._M_current;
        Mat::channel_range((Mat *)in_stack_fffffffffffffbc8._M_current,
                           (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20),
                           (int)in_stack_fffffffffffffbc0);
        local_294 = (int)local_250;
        for (local_298 = 0; local_298 < local_80; local_298 = local_298 + 1) {
          for (local_29c = 0; local_29c < local_7c; local_29c = local_29c + 1) {
            local_2a0 = 0;
            local_2a4 = -3.4028235e+38;
            local_2b0 = (float *)(local_290 + (long)(local_298 * local_7c) * 4 + (long)local_29c * 4
                                 );
            local_2b8 = local_2b0 +
                        *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) * local_294;
            local_2bc = 0;
            for (; local_2b0 < local_2b8; local_2b0 = local_2b0 + local_294) {
              if (local_2a4 < *local_2b0) {
                local_2a0 = local_2bc;
                local_2a4 = *local_2b0;
              }
              local_2bc = local_2bc + 1;
            }
            dVar9 = std::exp((double)((ulong)(uint)*(float *)&(local_200->super_Layer)._vptr_Layer ^
                                     0x8000000080000000));
            in_stack_fffffffffffffbec = SUB84(dVar9,0);
            dVar9 = std::exp((double)((ulong)(uint)local_2a4 ^ 0x8000000080000000));
            in_stack_fffffffffffffbe8 = SUB84(dVar9,0);
            local_2c0 = 1.0 / (in_stack_fffffffffffffbec * (in_stack_fffffffffffffbe8 + 1.0) + 1.0);
            if (*(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) <= local_2c0) {
              in_stack_fffffffffffffbe0 = (float)local_29c;
              in_stack_fffffffffffffbe4 = sigmoid(0.0);
              local_2c4 = (in_stack_fffffffffffffbe0 + in_stack_fffffffffffffbe4) / (float)local_7c;
              fVar8 = (float)local_298;
              in_stack_fffffffffffffbdc = sigmoid(0.0);
              local_2c8 = (fVar8 + in_stack_fffffffffffffbdc) / (float)local_80;
              dVar9 = std::exp((double)(ulong)(uint)*local_160);
              local_2cc = (SUB84(dVar9,0) * local_b0) / (float)local_9c;
              dVar9 = std::exp((double)(ulong)(uint)local_1b0->score);
              local_2d0 = (SUB84(dVar9,0) * local_b4) / (float)local_a0;
              local_2fc = local_2c4 - local_2cc * 0.5;
              local_2f8 = local_2c8 - local_2d0 * 0.5;
              local_2f4 = local_2c4 + local_2cc * 0.5;
              local_2f0 = local_2c8 + local_2d0 * 0.5;
              local_2ec = local_2cc * local_2d0;
              local_300 = local_2c0;
              local_2e8 = local_2a0;
              local_2e4 = local_2ec;
              local_2e0 = local_2f0;
              local_2dc = local_2f4;
              local_2d8 = local_2f8;
              local_2d4 = local_2fc;
              std::
              vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              ::operator[](&local_60,(long)local_a4);
              std::
              vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
              ::push_back((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                           *)in_stack_fffffffffffffbb0,
                          (value_type *)
                          CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8));
            }
            local_c0 = local_c0 + 1;
            local_110 = local_110 + 1;
            local_160 = local_160 + 1;
            local_1b0 = (BBoxRect *)&local_1b0->xmin;
            local_200 = (Yolov3DetectionOutput *)((long)&(local_200->super_Layer)._vptr_Layer + 4);
          }
        }
        Mat::~Mat((Mat *)0x6db513);
      }
      for (local_304 = 0; local_304 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          local_304 = local_304 + 1) {
        local_310 = std::
                    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                    ::operator[](&local_60,(long)local_304);
        in_stack_fffffffffffffbc0 = (Mat *)local_40;
        local_320 = (BBoxRect *)
                    std::
                    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ::end(in_stack_fffffffffffffb98);
        __gnu_cxx::
        __normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>
        ::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect*>
                  ((__normal_iterator<const_ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
                    *)in_stack_fffffffffffffba0,
                   (__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
                    *)in_stack_fffffffffffffb98);
        local_328 = (BBoxRect *)
                    std::
                    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ::begin(in_stack_fffffffffffffb98);
        local_330 = (BBoxRect *)
                    std::
                    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ::end(in_stack_fffffffffffffb98);
        __last._M_current._4_4_ = in_stack_fffffffffffffbec;
        __last._M_current._0_4_ = in_stack_fffffffffffffbe8;
        in_stack_fffffffffffffbc8 =
             std::
             vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
             ::
             insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>,void>
                       ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                        in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,__last);
        local_338 = in_stack_fffffffffffffbc8._M_current;
      }
      local_8c = 0;
    }
    else {
      local_4 = -1;
      local_8c = 1;
    }
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
               *)in_stack_fffffffffffffbb0);
    if (local_8c != 0) goto LAB_006db9f4;
    local_48 = local_48 + 1;
  }
  Yolov3DetectionOutput::qsort_descent_inplace
            (in_stack_fffffffffffffbb0,
             (vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
              *)CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8));
  pvVar10 = &local_350;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x6db6a2);
  Yolov3DetectionOutput::nms_sorted_bboxes
            ((Yolov3DetectionOutput *)in_stack_fffffffffffffbf0._M_current,
             (vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
              *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),in_stack_fffffffffffffbdc
            );
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            *)0x6db6e1);
  local_370 = (Yolov3DetectionOutput *)0x0;
  while( true ) {
    in_stack_fffffffffffffbb0 = local_370;
    pYVar5 = (Yolov3DetectionOutput *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_350);
    if (pYVar5 <= in_stack_fffffffffffffbb0) break;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_350,(size_type)local_370);
    std::
    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ::operator[]((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                  *)local_40,*pvVar6);
    std::
    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ::push_back((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 *)in_stack_fffffffffffffbb0,
                (value_type *)CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8));
    local_370 = (Yolov3DetectionOutput *)((long)&(local_370->super_Layer)._vptr_Layer + 1);
  }
  sVar3 = std::
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
          ::size(&local_368);
  if ((int)sVar3 == 0) {
    local_4 = 0;
  }
  else {
    this_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_40._32_8_,0);
    Mat::create(in_stack_fffffffffffffbc0,(int)((ulong)pvVar10 >> 0x20),(int)pvVar10,
                (size_t)in_stack_fffffffffffffbb0,
                (Allocator *)CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8));
    bVar2 = Mat::empty(in_stack_fffffffffffffba0);
    if (bVar2) {
      local_4 = -100;
    }
    else {
      for (local_38c = 0; local_38c < (int)sVar3; local_38c = local_38c + 1) {
        pvVar7 = std::
                 vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 ::operator[](&local_368,(long)local_38c);
        fVar8 = pvVar7->score;
        pfVar4 = Mat::row(this_00,local_38c);
        *pfVar4 = (float)(pvVar7->label + 1);
        pfVar4[1] = fVar8;
        pfVar4[2] = pvVar7->xmin;
        pfVar4[3] = pvVar7->ymin;
        pfVar4[4] = pvVar7->xmax;
        pfVar4[5] = pvVar7->ymax;
      }
      local_4 = 0;
    }
  }
  local_8c = 1;
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::~vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
             *)in_stack_fffffffffffffbb0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffbb0);
LAB_006db9f4:
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::~vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
             *)in_stack_fffffffffffffbb0);
  return local_4;
}

Assistant:

int Yolov3DetectionOutput_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = scores.cstep;

#if __AVX__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + exp(-box_score_ptr[0]) * (1.f + exp(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}